

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O0

void __thiscall CaDiCaL::External::push_clause_literal_on_extension_stack(External *this,int ilit)

{
  undefined4 in_ESI;
  value_type_conflict3 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  int elit;
  undefined4 in_stack_fffffffffffffff0;
  
  Internal::externalize
            ((Internal *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
  std::vector<int,_std::allocator<int>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void External::push_clause_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing clause literal %d on extension stack (internal %d)", elit,
       ilit);
}